

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_texture_region
               (rf_texture2d texture,rf_rec source_rec,rf_rec dest_rec,rf_vec2 origin,float rotation
               ,rf_color tint)

{
  bool bVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  _Bool flip_x;
  float height;
  float width;
  float rotation_local;
  rf_color tint_local;
  rf_vec2 origin_local;
  rf_rec dest_rec_local;
  rf_rec source_rec_local;
  
  dest_rec_local._8_8_ = source_rec._0_8_;
  if (texture.id != 0) {
    fVar3 = (float)texture.width;
    fVar4 = (float)texture.height;
    source_rec_local.x = source_rec.width;
    bVar1 = source_rec_local.x < 0.0;
    uVar2 = source_rec._8_8_;
    if (bVar1) {
      source_rec_local.y = source_rec.height;
      source_rec_local.x = source_rec_local.x * -1.0;
      uVar2 = source_rec_local._0_8_;
    }
    source_rec_local._0_8_ = uVar2;
    if (source_rec_local.y < 0.0) {
      dest_rec_local.height = source_rec.y;
      dest_rec_local.width = source_rec.x;
      dest_rec_local.height = dest_rec_local.height - source_rec_local.y;
    }
    rf_gfx_enable_texture(texture.id);
    rf_gfx_push_matrix();
    origin_local.x = dest_rec.x;
    origin_local.y = dest_rec.y;
    rf_gfx_translatef(origin_local.x,origin_local.y,0.0);
    rf_gfx_rotatef(rotation,0.0,0.0,1.0);
    rotation_local = origin.x;
    tint_local = (rf_color)origin.y;
    rf_gfx_translatef(-rotation_local,-(float)tint_local,0.0);
    rf_gfx_begin(RF_QUADS);
    width._0_1_ = tint.r;
    width._1_1_ = tint.g;
    width._2_1_ = tint.b;
    width._3_1_ = tint.a;
    rf_gfx_color4ub(width._0_1_,width._1_1_,width._2_1_,width._3_1_);
    rf_gfx_normal3f(0.0,0.0,1.0);
    if (bVar1) {
      rf_gfx_tex_coord2f((dest_rec_local.width + source_rec_local.x) / fVar3,
                         dest_rec_local.height / fVar4);
    }
    else {
      rf_gfx_tex_coord2f(dest_rec_local.width / fVar3,dest_rec_local.height / fVar4);
    }
    rf_gfx_vertex2f(0.0,0.0);
    if (bVar1) {
      rf_gfx_tex_coord2f((dest_rec_local.width + source_rec_local.x) / fVar3,
                         (dest_rec_local.height + source_rec_local.y) / fVar4);
    }
    else {
      rf_gfx_tex_coord2f(dest_rec_local.width / fVar3,
                         (dest_rec_local.height + source_rec_local.y) / fVar4);
    }
    dest_rec_local.y = dest_rec.height;
    rf_gfx_vertex2f(0.0,dest_rec_local.y);
    if (bVar1) {
      rf_gfx_tex_coord2f(dest_rec_local.width / fVar3,
                         (dest_rec_local.height + source_rec_local.y) / fVar4);
    }
    else {
      rf_gfx_tex_coord2f((dest_rec_local.width + source_rec_local.x) / fVar3,
                         (dest_rec_local.height + source_rec_local.y) / fVar4);
    }
    dest_rec_local.x = dest_rec.width;
    rf_gfx_vertex2f(dest_rec_local.x,dest_rec_local.y);
    if (bVar1) {
      rf_gfx_tex_coord2f(dest_rec_local.width / fVar3,dest_rec_local.height / fVar4);
    }
    else {
      rf_gfx_tex_coord2f((dest_rec_local.width + source_rec_local.x) / fVar3,
                         dest_rec_local.height / fVar4);
    }
    rf_gfx_vertex2f(dest_rec_local.x,0.0);
    rf_gfx_end();
    rf_gfx_pop_matrix();
    rf_gfx_disable_texture();
  }
  return;
}

Assistant:

RF_API void rf_draw_texture_region(rf_texture2d texture, rf_rec source_rec, rf_rec dest_rec, rf_vec2 origin, float rotation, rf_color tint)
{
    // Check if texture is valid
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        bool flip_x = false;

        if (source_rec.width < 0) { flip_x = true; source_rec.width *= -1; }
        if (source_rec.height < 0) source_rec.y -= source_rec.height;

        rf_gfx_enable_texture(texture.id);

        rf_gfx_push_matrix();
            rf_gfx_translatef(dest_rec.x, dest_rec.y, 0.0f);
            rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
            rf_gfx_translatef(-origin.x, -origin.y, 0.0f);

            rf_gfx_begin(RF_QUADS);
                rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);
                rf_gfx_normal3f(0.0f, 0.0f, 1.0f); // Normal vector pointing towards viewer

                // Bottom-left corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, source_rec.y / height);
                else rf_gfx_tex_coord2f(source_rec.x / width, source_rec.y / height);
                rf_gfx_vertex2f(0.0f, 0.0f);

                // Bottom-right corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, (source_rec.y + source_rec.height) / height);
                else rf_gfx_tex_coord2f(source_rec.x / width, (source_rec.y + source_rec.height) / height);
                rf_gfx_vertex2f(0.0f, dest_rec.height);

                // Top-right corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f(source_rec.x / width, (source_rec.y + source_rec.height) / height);
                else rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, (source_rec.y + source_rec.height) / height);
                rf_gfx_vertex2f(dest_rec.width, dest_rec.height);

                // Top-left corner for texture and quad
                if (flip_x) rf_gfx_tex_coord2f(source_rec.x / width, source_rec.y / height);
                else rf_gfx_tex_coord2f((source_rec.x + source_rec.width) / width, source_rec.y / height);
                rf_gfx_vertex2f(dest_rec.width, 0.0f);
            rf_gfx_end();
        rf_gfx_pop_matrix();

        rf_gfx_disable_texture();
    }
}